

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_zip_options(archive_write *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  code *pcVar4;
  archive_string_conv *paVar5;
  char *pcVar6;
  char *fmt;
  
  pvVar1 = a->format_data;
  iVar2 = strcmp(key,"compression");
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      pcVar6 = a->format_name;
      fmt = "%s: compression option needs a compression name";
LAB_0043da80:
      archive_set_error(&a->archive,-1,fmt,pcVar6);
      return -0x19;
    }
    iVar2 = strcmp(val,"deflate");
    if (iVar2 == 0) {
      *(undefined4 *)((long)pvVar1 + 0xa0) = 8;
    }
    else {
      iVar2 = strcmp(val,"store");
      if (iVar2 != 0) {
        return -0x19;
      }
      *(undefined4 *)((long)pvVar1 + 0xa0) = 0;
    }
  }
  else {
    iVar2 = strcmp(key,"experimental");
    if (iVar2 == 0) {
      if ((val == (char *)0x0) || (*val == '\0')) {
        *(byte *)((long)pvVar1 + 0xa8) = *(byte *)((long)pvVar1 + 0xa8) & 0xfb;
      }
      else {
        *(byte *)((long)pvVar1 + 0xa8) = *(byte *)((long)pvVar1 + 0xa8) | 4;
      }
    }
    else {
      iVar2 = strcmp(key,"fakecrc32");
      if (iVar2 == 0) {
        if ((val == (char *)0x0) || (*val == '\0')) {
          pcVar4 = real_crc32;
        }
        else {
          pcVar4 = fake_crc32;
        }
        *(code **)((long)pvVar1 + 0x60) = pcVar4;
      }
      else {
        iVar2 = strcmp(key,"hdrcharset");
        if (iVar2 == 0) {
          if ((val != (char *)0x0) && (*val != '\0')) {
            paVar5 = archive_string_conversion_to_charset(&a->archive,val,L'\0');
            *(archive_string_conv **)((long)pvVar1 + 0x90) = paVar5;
            if (paVar5 == (archive_string_conv *)0x0) {
              return -0x1e;
            }
            return 0;
          }
          pcVar6 = a->format_name;
          fmt = "%s: hdrcharset option needs a character-set name";
          goto LAB_0043da80;
        }
        iVar2 = strcmp(key,"zip64");
        if (iVar2 != 0) {
          return -0x14;
        }
        if ((val == (char *)0x0) || (*val == '\0')) {
          uVar3 = (*(uint *)((long)pvVar1 + 0xa8) & 0xfffffffc) + 1;
        }
        else {
          uVar3 = *(uint *)((long)pvVar1 + 0xa8) & 0xfffffffc | 2;
        }
        *(uint *)((long)pvVar1 + 0xa8) = uVar3;
      }
    }
  }
  return 0;
}

Assistant:

static int
archive_write_zip_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct zip *zip = a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "compression") == 0) {
		/*
		 * Set compression to use on all future entries.
		 * This only affects regular files.
		 */
		if (val == NULL || val[0] == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: compression option needs a compression name",
			    a->format_name);
		} else if (strcmp(val, "deflate") == 0) {
#ifdef HAVE_ZLIB_H
			zip->requested_compression = COMPRESSION_DEFLATE;
			ret = ARCHIVE_OK;
#else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "deflate compression not supported");
#endif
		} else if (strcmp(val, "store") == 0) {
			zip->requested_compression = COMPRESSION_STORE;
			ret = ARCHIVE_OK;
		}
		return (ret);
	} else if (strcmp(key, "experimental") == 0) {
		if (val == NULL || val[0] == 0) {
			zip->flags &= ~ ZIP_FLAG_EXPERIMENT_EL;
		} else {
			zip->flags |= ZIP_FLAG_EXPERIMENT_EL;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "fakecrc32") == 0) {
		/*
		 * FOR TESTING ONLY:  disable CRC calculation to speed up
		 * certain complex tests.
		 */
		if (val == NULL || val[0] == 0) {
			zip->crc32func = real_crc32;
		} else {
			zip->crc32func = fake_crc32;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		/*
		 * Set the character set used in translating filenames.
		 */
		if (val == NULL || val[0] == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: hdrcharset option needs a character-set name",
			    a->format_name);
		} else {
			zip->opt_sconv = archive_string_conversion_to_charset(
			    &a->archive, val, 0);
			if (zip->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "zip64") == 0) {
		/*
		 * Bias decisions about Zip64: force them to be
		 * generated in certain cases where they are not
		 * forbidden or avoid them in certain cases where they
		 * are not strictly required.
		 */
		if (val != NULL && *val != '\0') {
			zip->flags |= ZIP_FLAG_FORCE_ZIP64;
			zip->flags &= ~ZIP_FLAG_AVOID_ZIP64;
		} else {
			zip->flags &= ~ZIP_FLAG_FORCE_ZIP64;
			zip->flags |= ZIP_FLAG_AVOID_ZIP64;
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}